

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O1

void parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char examplestr [506];
  char helpstr [901];
  undefined1 auStack_5a8 [512];
  undefined1 local_3a8 [912];
  
  memcpy(local_3a8,
         "Description: \n\n(Copied from Rita\'s comment and I think it is a pretty good description.) \n    Multi-function routine to generate mdef for context-independent \n    training, untied training, and all-triphones mdef for state tying.\n Flow: \n    if (triphonelist) make CI phone list and CD phone list \n\t  if alltriphones mdef needed, make mdef \n    if (rawphonelist) Make ci phone list,  \n        if cimdef needed, make mdef \n        Generate alltriphones list from dictionary \n        if alltriphones mdef needed, make mdef \n    if neither triphonelist or rawphonelist quit \n    Count triphones and triphone types in transcript \n    Adjust threshold according to min-occ and maxtriphones \n    Prune triphone list \n    Make untied mdef \n\nUsually, this program is used in \n1) generate CI mdef \n2) generate CD mdef given dictionary and transcription \n3) generate CD mdef given dictionary \nAlso see examples"
         ,0x385);
  memcpy(auStack_5a8,
         "Example: \nCreate CI model definition file \nmk_mdef_gen -phnlstfn phonefile -ocimdef ci_mdeffile -n_state_pm 3\n\nCreate untied CD model definition file given dictionary and transcription\nmk_mdef_gen -phnlstfn rawphonefile -dictfn dict -fdictfn filler_dict \n-lsnfn transcription -ountiedmdef untie_mdef -n_state_pm 3 \n-maxtriphones 10000 \nCreate all CD model definition file given only the dictionary \nmk_mdef_gen -phnlstfn rawphone -oalltphnmdef untie_mdef -dictfn dict \n -fdictfn filler_dict -n_state_pm 3."
         ,0x1fa);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",local_3a8);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",auStack_5a8);
  }
  if ((int)lVar3 == 0 && (int)lVar2 == 0) {
    return;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/parse_cmd_ln.c"
          ,0xc1,"User asked for help or example.\n");
  exit(0);
}

Assistant:

void parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

  const char helpstr[] = 
"Description: \n\
\n\
(Copied from Rita's comment and I think it is a pretty good description.) \n\
    Multi-function routine to generate mdef for context-independent \n\
    training, untied training, and all-triphones mdef for state tying.\n\
 Flow: \n\
    if (triphonelist) make CI phone list and CD phone list \n\
	  if alltriphones mdef needed, make mdef \n\
    if (rawphonelist) Make ci phone list,  \n\
        if cimdef needed, make mdef \n\
        Generate alltriphones list from dictionary \n\
        if alltriphones mdef needed, make mdef \n\
    if neither triphonelist or rawphonelist quit \n\
    Count triphones and triphone types in transcript \n\
    Adjust threshold according to min-occ and maxtriphones \n\
    Prune triphone list \n\
    Make untied mdef \n\
\n\
Usually, this program is used in \n\
1) generate CI mdef \n\
2) generate CD mdef given dictionary and transcription \n\
3) generate CD mdef given dictionary \n\
Also see examples";

  const char examplestr[]=
"Example: \n\
Create CI model definition file \n\
mk_mdef_gen -phnlstfn phonefile -ocimdef ci_mdeffile -n_state_pm 3\n\
\n\
Create untied CD model definition file given dictionary and transcription\n\
mk_mdef_gen -phnlstfn rawphonefile -dictfn dict -fdictfn filler_dict \n\
-lsnfn transcription -ountiedmdef untie_mdef -n_state_pm 3 \n\
-maxtriphones 10000 \n\
Create all CD model definition file given only the dictionary \n\
mk_mdef_gen -phnlstfn rawphone -oalltphnmdef untie_mdef -dictfn dict \n\
 -fdictfn filler_dict -n_state_pm 3.";

    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-ignorewpos",
	  ARG_BOOLEAN,
	  "no",
	  "Ignore word position in context dependency"},
	{ "-phnlstfn",
	  ARG_STRING,
	  NULL,
	  "List of phones"},
	{ "-inCImdef",
	  ARG_STRING,
	  NULL,
	  "Input CI model definition file.\n\t\t\tIf given -phnlstfn ignored\n"},
	{ "-triphnlstfn",
	  ARG_STRING,
	  NULL,
	  "A SPHINX-III triphone file name.\n\t\t\tIf given -phnlstfn, -incimdef ignored\n" },
	{ "-inCDmdef",
	  ARG_STRING,
	  NULL,
	  "Input CD model definition file.\n\t\t\tIf given -triphnfn, -phnlstfn, -incimdef ignored\n"},
	{ "-dictfn",
	  ARG_STRING,
	  NULL,
	  "Dictionary"},
	{ "-fdictfn",
	  ARG_STRING,
	  NULL,
	  "Filler dictionary"},
	{ "-lsnfn",
	  ARG_STRING,
	  NULL,
	  "Transcripts file"},
	{ "-n_state_pm",
	  ARG_INT32,
	  "3",
	  "No. of states per HMM"},
	{ "-ocountfn",
	  ARG_STRING,
	  NULL,
	  "Output phone and triphone counts file"},
	{ "-ocimdef",
	  ARG_STRING,
	  NULL,
	  "Output CI model definition file"},
	{ "-oalltphnmdef",
	  ARG_STRING,
	  NULL,
	  "Output all triphone model definition file"},
	{ "-ountiedmdef",
	  ARG_STRING,
	  NULL,
	  "Output untied model definition file"},
	{ "-minocc",
	  ARG_INT32,
	  "1",
	  "Min occurances of a triphone must occur for inclusion in mdef file"},
	{ "-maxtriphones",
	  ARG_INT32,
	  "100000",
	  "Max. number of triphones desired in mdef file"},
	{ NULL,
	  0,
	  NULL,
	  NULL }
    };

    cmd_ln_parse(defn, argc, argv, TRUE);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }
}